

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTApt.cpp
# Opt level: O3

void PurgeApt(boundingBoxTy *_box)

{
  long *plVar1;
  bool bVar2;
  int iVar3;
  _Base_ptr p_Var4;
  const_iterator __position;
  long *local_70 [2];
  long local_60 [2];
  string local_50;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&mtxGMapApt);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  __position._M_node = gmapApt_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)gmapApt_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      &gmapApt_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
    do {
      bVar2 = boundingBoxTy::overlap((boundingBoxTy *)(__position._M_node + 3),_box);
      if (bVar2) {
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
      }
      else {
        if ((int)dataRefs.iLogLevel < 1) {
          local_70[0] = local_60;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_70,*(long *)(__position._M_node + 2),
                     (long)&(__position._M_node[2]._M_parent)->_M_color +
                     *(long *)(__position._M_node + 2));
          plVar1 = local_70[0];
          boundingBoxTy::operator_cast_to_string
                    (&local_50,(boundingBoxTy *)(__position._M_node + 3));
          LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTApt.cpp"
                 ,0x948,"PurgeApt",logDEBUG,"apt.dat: Removed %s at %s",plVar1,
                 local_50._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          if (local_70[0] != local_60) {
            operator_delete(local_70[0],local_60[0] + 1);
          }
        }
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Apt>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Apt>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Apt>_>_>
        ::_M_erase_aux(&gmapApt_abi_cxx11_._M_t,__position);
      }
      __position._M_node = p_Var4;
    } while ((_Rb_tree_header *)p_Var4 != &gmapApt_abi_cxx11_._M_t._M_impl.super__Rb_tree_header);
  }
  if ((int)dataRefs.iLogLevel < 1) {
    LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTApt.cpp",
           0x94d,"PurgeApt",logDEBUG,"Done purging, %d airports left",
           (ulong)(uint)gmapApt_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&mtxGMapApt);
  return;
}

Assistant:

void PurgeApt (const boundingBoxTy& _box)
{
    // Access is guarded by a lock
    std::lock_guard<std::mutex> lock(mtxGMapApt);

    // loop all airports and remove those, whose center point is outside the box
    mapAptTy::iterator iter = gmapApt.begin();
    while (iter != gmapApt.end())
    {
        // Is airport still in box?
        Apt& apt = iter->second;
        if (apt.GetBounds().overlap(_box)) {
            // keep it, move on to next airport
            ++iter;
        } else {
            // remove it, move on to next airport
            LOG_MSG(logDEBUG, "apt.dat: Removed %s at %s",
                    apt.GetId().c_str(),
                    std::string(apt.GetBounds()).c_str());
            iter = gmapApt.erase(iter);
        }
    }
    
    LOG_MSG(logDEBUG, "Done purging, %d airports left", (int)gmapApt.size());
}